

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultFrontLoadedReporter.cpp
# Opt level: O0

void __thiscall
ApprovalTests::DefaultFrontLoadedReporter::DefaultFrontLoadedReporter
          (DefaultFrontLoadedReporter *this)

{
  CIBuildOnlyReporter *this_00;
  shared_ptr<ApprovalTests::Reporter> *in_RDI;
  shared_ptr<ApprovalTests::TextDiffReporter> *in_stack_ffffffffffffff78;
  allocator_type *in_stack_ffffffffffffffa8;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
  *in_stack_ffffffffffffffb0;
  initializer_list<ApprovalTests::Reporter_*> in_stack_ffffffffffffffb8;
  Reporter theReporters;
  FirstWorkingReporter *this_01;
  
  this_00 = (CIBuildOnlyReporter *)operator_new(0x16a3f6);
  ::std::make_shared<ApprovalTests::TextDiffReporter>();
  ::std::shared_ptr<ApprovalTests::Reporter>::shared_ptr<ApprovalTests::TextDiffReporter,void>
            ((shared_ptr<ApprovalTests::Reporter> *)&stack0xffffffffffffffb8,
             in_stack_ffffffffffffff78);
  CIBuildOnlyReporter::CIBuildOnlyReporter(this_00,in_RDI);
  this_01 = (FirstWorkingReporter *)&stack0xffffffffffffffc8;
  theReporters._vptr_Reporter = (_func_int **)this_00;
  ::std::allocator<ApprovalTests::Reporter_*>::allocator
            ((allocator<ApprovalTests::Reporter_*> *)0x16a461);
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffa8);
  FirstWorkingReporter::FirstWorkingReporter
            (this_01,(vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
                      *)theReporters._vptr_Reporter);
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::~vector
            ((vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
             this_00);
  ::std::allocator<ApprovalTests::Reporter_*>::~allocator
            ((allocator<ApprovalTests::Reporter_*> *)0x16a4a0);
  ::std::shared_ptr<ApprovalTests::Reporter>::~shared_ptr
            ((shared_ptr<ApprovalTests::Reporter> *)0x16a4aa);
  ::std::shared_ptr<ApprovalTests::TextDiffReporter>::~shared_ptr
            ((shared_ptr<ApprovalTests::TextDiffReporter> *)0x16a4b4);
  (in_RDI->super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__DefaultFrontLoadedReporter_001c9e88;
  return;
}

Assistant:

DefaultFrontLoadedReporter::DefaultFrontLoadedReporter()
        : FirstWorkingReporter({new CIBuildOnlyReporter()})
    {
    }